

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O0

basic_ostream<char,_std::char_traits<char>_> *
pstore::dump::string::write_quoted<std::ostream>
          (basic_ostream<char,_std::char_traits<char>_> *os,string *v)

{
  bool bVar1;
  reference pcVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_30;
  char ch;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  string *v_local;
  basic_ostream<char,_std::char_traits<char>_> *os_local;
  
  std::operator<<(os,"\"");
  __end2._M_current = (char *)std::__cxx11::string::begin();
  _Stack_30._M_current = (char *)std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffd0), bVar1) {
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end2);
    switch(*pcVar2) {
    case '\0':
      std::operator<<(os,"\\0");
      break;
    default:
      write_character<std::ostream>(os,*pcVar2);
      break;
    case '\a':
      std::operator<<(os,"\\a");
      break;
    case '\b':
      std::operator<<(os,"\\b");
      break;
    case '\t':
      std::operator<<(os,"\\t");
      break;
    case '\n':
      std::operator<<(os,"\\n");
      break;
    case '\v':
      std::operator<<(os,"\\v");
      break;
    case '\f':
      std::operator<<(os,"\\f");
      break;
    case '\r':
      std::operator<<(os,"\\r");
      break;
    case '\x1b':
      std::operator<<(os,"\\e");
      break;
    case '\"':
      std::operator<<(os,"\\\"");
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end2);
  }
  std::operator<<(os,"\"");
  return os;
}

Assistant:

OStream & string::write_quoted (OStream & os, std::string const & v) {
            os << "\"";
            for (char const ch : v) {
                switch (ch) {
                case '\0': os << "\\0"; break;
                case '\x7': os << "\\a"; break;
                case '\x8': os << "\\b"; break;
                case '\x9': os << "\\t"; break;
                case '\xa': os << "\\n"; break;
                case '\xb': os << "\\v"; break;
                case '\xc': os << "\\f"; break;
                case '\xd': os << "\\r"; break;
                case '\x1b': os << "\\e"; break;
                case '"': os << "\\\""; break;
                default: write_character (os, ch); break;
                }
            }
            os << "\"";
            return os;
        }